

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.cpp
# Opt level: O0

Collision * __thiscall
Plane::collide(Collision *__return_storage_ptr__,Plane *this,Vector3 *start,Vector3 *dir)

{
  Vector3 *pVVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double t_00;
  Vector3 local_50;
  double local_38;
  double t;
  double d;
  double n;
  Vector3 *dir_local;
  Vector3 *start_local;
  Plane *this_local;
  
  n = (double)dir;
  dir_local = start;
  start_local = (Vector3 *)this;
  dVar2 = Vector3::dot(&this->m_n,start);
  d = dVar2 + this->m_d;
  pVVar1 = &this->m_n;
  t = Vector3::dot(pVVar1,(Vector3 *)n);
  std::abs((int)pVVar1);
  pVVar1 = dir_local;
  dVar2 = n;
  if (1e-06 <= extraout_XMM0_Qa) {
    t_00 = -d / t;
    local_38 = t_00;
    if (1e-06 <= t_00) {
      if (d <= 1e-06) {
        Vector3::operator-(&local_50,&this->m_n);
        Collision::Collision
                  (__return_storage_ptr__,pVVar1,(Vector3 *)dVar2,t_00,&local_50,true,
                   &this->super_Object);
      }
      else {
        Collision::Collision
                  (__return_storage_ptr__,dir_local,(Vector3 *)n,t_00,&this->m_n,false,
                   &this->super_Object);
      }
    }
    else {
      Collision::Collision(__return_storage_ptr__);
    }
  }
  else {
    Collision::Collision(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Collision Plane::collide(const Vector3& start, const Vector3& dir) const
{
    double n = m_n.dot(start) + m_d, d = m_n.dot(dir);
    if (abs(d) < Const::EPS) return Collision();
    double t = -n / d;
    if (t < Const::EPS) return Collision();
    if (n > Const::EPS)
        return Collision(start, dir, t, m_n, false, this);
    else
        return Collision(start, dir, t, -m_n, true, this);
}